

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOpaqueAttribute.cpp
# Opt level: O1

void __thiscall
Imf_3_4::OpaqueAttribute::OpaqueAttribute(OpaqueAttribute *this,OpaqueAttribute *other)

{
  pointer pcVar1;
  ulong uVar2;
  char *pcVar3;
  char *__dest;
  
  Attribute::Attribute(&this->super_Attribute);
  (this->super_Attribute)._vptr_Attribute = (_func_int **)&PTR__OpaqueAttribute_001e5d38;
  (this->_typeName)._M_dataplus._M_p = (pointer)&(this->_typeName).field_2;
  pcVar1 = (other->_typeName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_typeName,pcVar1,pcVar1 + (other->_typeName)._M_string_length);
  this->_dataSize = other->_dataSize;
  uVar2 = other->_dataSize;
  pcVar3 = (char *)operator_new__(uVar2);
  (this->_data)._data = pcVar3;
  (this->_data)._size = uVar2;
  __dest = (char *)operator_new__(uVar2);
  operator_delete__(pcVar3);
  (this->_data)._size = uVar2;
  (this->_data)._data = __dest;
  memcpy(__dest,(other->_data)._data,other->_dataSize);
  return;
}

Assistant:

OpaqueAttribute::OpaqueAttribute (const OpaqueAttribute& other)
    : _typeName (other._typeName)
    , _dataSize (other._dataSize)
    , _data (other._dataSize)
{
    _data.resizeErase (other._dataSize);
    memcpy ((char*) _data, (const char*) other._data, other._dataSize);
}